

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

char * getattrib(rnndb *db,char *file,int line,xmlAttr *attr)

{
  _xmlNode *p_Var1;
  _xmlNode **pp_Var2;
  
  pp_Var2 = &attr->children;
  while( true ) {
    p_Var1 = *pp_Var2;
    if (p_Var1 == (_xmlNode *)0x0) {
      return "";
    }
    if (p_Var1->type == XML_TEXT_NODE) break;
    fprintf(_stderr,"%s:%d: unknown attribute child \"%s\" in attribute \"%s\"\n",file,
            (ulong)(uint)line,p_Var1->name,attr->name);
    db->estatus = 1;
    pp_Var2 = &p_Var1->next;
  }
  return (char *)p_Var1->content;
}

Assistant:

static char *getattrib (struct rnndb *db, char *file, int line, xmlAttr *attr) {
	xmlNode *chain = attr->children;
	while (chain) {
		if (chain->type != XML_TEXT_NODE) {
			fprintf (stderr, "%s:%d: unknown attribute child \"%s\" in attribute \"%s\"\n", file, line, chain->name, attr->name);
			db->estatus = 1;
		} else {
			return chain->content;
		}
		chain = chain->next;
	}
	return "";
}